

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O0

bool __thiscall
HighsImplications::runProbing(HighsImplications *this,HighsInt col,HighsInt *numReductions)

{
  double dVar1;
  bool bVar2;
  pointer pHVar3;
  Substitution *pSVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  double *pdVar8;
  reference pvVar9;
  int *in_RDX;
  int iVar10;
  long in_RDI;
  double extraout_XMM0_Qa;
  double ub;
  double lb;
  HighsSubstitution substitution;
  double ubUp;
  double lbUp;
  double ubDown;
  double lbDown;
  HighsInt implcol;
  HighsInt d;
  HighsInt u;
  HighsInt nimplicsup;
  HighsInt nimplicsdown;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *implicsup;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *implicsdown;
  bool infeasible;
  HighsDomain *globaldomain;
  bool in_stack_00000163;
  HighsInt in_stack_00000164;
  HighsImplications *in_stack_00000168;
  undefined1 in_stack_fffffffffffffeeb;
  HighsInt in_stack_fffffffffffffeec;
  HighsDomain *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  HighsDomain *in_stack_ffffffffffffff00;
  HighsDomain *pHVar11;
  HighsDomain *in_stack_ffffffffffffff08;
  Reason in_stack_ffffffffffffff10;
  value_type local_78;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_40;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_38;
  byte local_29;
  Reason local_28;
  int *local_20;
  
  local_20 = in_RDX;
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5ec3db);
  local_28 = (Reason)&pHVar3->domain;
  bVar2 = HighsDomain::isBinary(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  if (((bVar2) &&
      (bVar2 = implicationsCached((HighsImplications *)in_stack_fffffffffffffef0,
                                  in_stack_fffffffffffffeec,(bool)in_stack_fffffffffffffeeb), !bVar2
      )) && (bVar2 = implicationsCached((HighsImplications *)in_stack_fffffffffffffef0,
                                        in_stack_fffffffffffffeec,(bool)in_stack_fffffffffffffeeb),
            !bVar2)) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5ec454)
    ;
    pSVar4 = HighsCliqueTable::getSubstitution
                       ((HighsCliqueTable *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (pSVar4 == (Substitution *)0x0) {
      local_29 = computeImplications(in_stack_00000168,in_stack_00000164,in_stack_00000163);
      bVar2 = HighsDomain::infeasible((HighsDomain *)local_28);
      if (bVar2) {
        return true;
      }
      if ((local_29 & 1) != 0) {
        return true;
      }
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ec4df);
      pSVar4 = HighsCliqueTable::getSubstitution
                         ((HighsCliqueTable *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if (pSVar4 != (Substitution *)0x0) {
        return true;
      }
      local_29 = computeImplications(in_stack_00000168,in_stack_00000164,in_stack_00000163);
      bVar2 = HighsDomain::infeasible((HighsDomain *)local_28);
      if (bVar2) {
        return true;
      }
      if ((local_29 & 1) != 0) {
        return true;
      }
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ec570);
      pSVar4 = HighsCliqueTable::getSubstitution
                         ((HighsCliqueTable *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if (pSVar4 != (Substitution *)0x0) {
        return true;
      }
      local_38 = getImplications((HighsImplications *)in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc,
                                 SUB41((uint)in_stack_fffffffffffffef8 >> 0x18,0),
                                 (bool *)in_stack_fffffffffffffef0);
      local_40 = getImplications((HighsImplications *)in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc,
                                 SUB41((uint)in_stack_fffffffffffffef8 >> 0x18,0),
                                 (bool *)in_stack_fffffffffffffef0);
      sVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(local_38);
      local_44 = (int)sVar5;
      sVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(local_40);
      local_48 = (int)sVar5;
      local_4c = 0;
      local_50 = 0;
      do {
        while( true ) {
          do {
            do {
              while( true ) {
                while( true ) {
                  if (local_48 <= local_4c || local_44 <= local_50) {
                    return true;
                  }
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_40,(long)local_4c);
                  iVar10 = pvVar6->column;
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_38,(long)local_50);
                  if (pvVar6->column <= iVar10) break;
                  local_4c = local_4c + 1;
                }
                pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                         operator[](local_38,(long)local_50);
                iVar10 = pvVar6->column;
                pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                         operator[](local_40,(long)local_4c);
                if (pvVar6->column <= iVar10) break;
                local_50 = local_50 + 1;
              }
              pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                       operator[](local_40,(long)local_4c);
              local_54 = pvVar6->column;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  ((long)local_28 + 0x308),(long)local_54);
              local_60 = *pvVar7;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)((long)local_28 + 800),
                                  (long)local_54);
              local_78 = *pvVar7;
              local_70 = local_60;
              local_68 = local_78;
              do {
                pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                         operator[](local_38,(long)local_50);
                if (pvVar6->boundtype == kLower) {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_38,(long)local_50);
                  pdVar8 = std::max<double>(&local_60,&pvVar6->boundval);
                  local_60 = *pdVar8;
                }
                else {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_38,(long)local_50);
                  pdVar8 = std::min<double>(&local_68,&pvVar6->boundval);
                  local_68 = *pdVar8;
                }
                local_50 = local_50 + 1;
                bVar2 = false;
                if (local_50 < local_44) {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_38,(long)local_50);
                  bVar2 = pvVar6->column == local_54;
                }
              } while (bVar2);
              do {
                pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                         operator[](local_40,(long)local_4c);
                if (pvVar6->boundtype == kLower) {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_40,(long)local_4c);
                  pdVar8 = std::max<double>(&local_70,&pvVar6->boundval);
                  local_70 = *pdVar8;
                }
                else {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_40,(long)local_4c);
                  pdVar8 = std::min<double>(&local_78,&pvVar6->boundval);
                  local_78 = *pdVar8;
                }
                local_4c = local_4c + 1;
                bVar2 = false;
                if (local_4c < local_48) {
                  pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                           operator[](local_40,(long)local_4c);
                  bVar2 = pvVar6->column == local_54;
                }
              } while (bVar2);
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (in_RDI + 0x78),(long)local_54);
            } while (*pvVar9 != '\0');
            iVar10 = local_28.type;
            bVar2 = HighsDomain::isFixed(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          } while (bVar2);
          if ((local_60 == local_68) && (!NAN(local_60) && !NAN(local_68))) break;
LAB_005eca91:
          pdVar8 = std::min<double>(&local_60,&local_70);
          dVar1 = *pdVar8;
          pdVar8 = std::max<double>(&local_68,&local_78);
          pHVar11 = (HighsDomain *)*pdVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)((long)local_28 + 0x308),
                              (long)local_54);
          if (*pvVar7 <= dVar1 && dVar1 != *pvVar7) {
            in_stack_ffffffffffffff10 = local_28;
            HighsDomain::Reason::unspecified();
            HighsDomain::changeBound
                      (in_stack_ffffffffffffff08,
                       (HighsBoundType)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       in_stack_ffffffffffffff10);
            *local_20 = *local_20 + 1;
          }
          in_stack_ffffffffffffff08 = pHVar11;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)((long)local_28 + 800),
                              (long)local_54);
          if ((double)in_stack_ffffffffffffff08 < *pvVar7) {
            in_stack_fffffffffffffefc = local_54;
            HighsDomain::Reason::unspecified();
            HighsDomain::changeBound
                      (in_stack_ffffffffffffff08,(HighsBoundType)((ulong)pHVar11 >> 0x20),
                       (HighsInt)pHVar11,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       in_stack_ffffffffffffff10);
            *local_20 = *local_20 + 1;
            in_stack_ffffffffffffff00 = pHVar11;
          }
        }
        if ((local_70 != local_78) || (NAN(local_70) || NAN(local_78))) goto LAB_005eca91;
        std::abs(iVar10);
        pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5ec9f1);
        if (extraout_XMM0_Qa < pHVar3->feastol || extraout_XMM0_Qa == pHVar3->feastol)
        goto LAB_005eca91;
        std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::push_back
                  ((vector<HighsSubstitution,_std::allocator<HighsSubstitution>_> *)
                   in_stack_ffffffffffffff00,
                   (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x78)
                            ,(long)local_54);
        *pvVar9 = '\x01';
        *local_20 = *local_20 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool HighsImplications::runProbing(HighsInt col, HighsInt& numReductions) {
  HighsDomain& globaldomain = mipsolver.mipdata_->domain;
  if (globaldomain.isBinary(col) && !implicationsCached(col, 1) &&
      !implicationsCached(col, 0) &&
      mipsolver.mipdata_->cliquetable.getSubstitution(col) == nullptr) {
    bool infeasible;

    infeasible = computeImplications(col, 1);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    infeasible = computeImplications(col, 0);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    // analyze implications
    const std::vector<HighsDomainChange>& implicsdown =
        getImplications(col, 0, infeasible);
    const std::vector<HighsDomainChange>& implicsup =
        getImplications(col, 1, infeasible);
    HighsInt nimplicsdown = implicsdown.size();
    HighsInt nimplicsup = implicsup.size();
    HighsInt u = 0;
    HighsInt d = 0;

    while (u < nimplicsup && d < nimplicsdown) {
      if (implicsup[u].column < implicsdown[d].column)
        ++u;
      else if (implicsdown[d].column < implicsup[u].column)
        ++d;
      else {
        assert(implicsup[u].column == implicsdown[d].column);
        HighsInt implcol = implicsup[u].column;
        double lbDown = globaldomain.col_lower_[implcol];
        double ubDown = globaldomain.col_upper_[implcol];
        double lbUp = lbDown;
        double ubUp = ubDown;

        do {
          if (implicsdown[d].boundtype == HighsBoundType::kLower)
            lbDown = std::max(lbDown, implicsdown[d].boundval);
          else
            ubDown = std::min(ubDown, implicsdown[d].boundval);
          ++d;
        } while (d < nimplicsdown && implicsdown[d].column == implcol);

        do {
          if (implicsup[u].boundtype == HighsBoundType::kLower)
            lbUp = std::max(lbUp, implicsup[u].boundval);
          else
            ubUp = std::min(ubUp, implicsup[u].boundval);
          ++u;
        } while (u < nimplicsup && implicsup[u].column == implcol);

        if (colsubstituted[implcol] || globaldomain.isFixed(implcol)) continue;

        if (lbDown == ubDown && lbUp == ubUp &&
            std::abs(lbDown - lbUp) > mipsolver.mipdata_->feastol) {
          HighsSubstitution substitution;
          substitution.substcol = implcol;
          substitution.staycol = col;
          substitution.offset = lbDown;
          substitution.scale = lbUp - lbDown;
          substitutions.push_back(substitution);
          colsubstituted[implcol] = true;
          ++numReductions;
        } else {
          double lb = std::min(lbDown, lbUp);
          double ub = std::max(ubDown, ubUp);

          if (lb > globaldomain.col_lower_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kLower, implcol, lb,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }

          if (ub < globaldomain.col_upper_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kUpper, implcol, ub,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }
        }
      }
    }

    return true;
  }

  return false;
}